

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O2

future<int> __thiscall prometheus::Gateway::AsyncDeleteForInstance(Gateway *this)

{
  pointer p_Var1;
  _Result<int> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  _State_baseV2 *__tmp;
  future<int> fVar3;
  __allocator_type __a2;
  __state_type local_88;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_78;
  thread local_68;
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pointer)operator_new(0x50);
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_001268a0;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
  local_78._M_alloc = &__a2;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = 0;
  *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = 0;
  (p_Var1->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_001268f0;
  local_78._M_ptr = p_Var1;
  p_Var2 = (_Result<int> *)operator_new(0x18);
  ::std::__future_base::_Result<int>::_Result(p_Var2);
  *(_Result<int> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x30) = p_Var2;
  *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x38) = in_RSI;
  local_68._M_id._M_thread = (id)0;
  ___a2_1 = (long *)operator_new(0x20);
  *___a2_1 = (long)&PTR___State_00126948;
  ___a2_1[1] = (long)&p_Var1->_M_impl;
  ___a2_1[2] = (long)::std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:203:41)>_>,_int>
                     ::_M_run;
  ___a2_1[3] = 0;
  ::std::thread::_M_start_thread(&local_68,&__a2_1,0);
  if (___a2_1 != (long *)0x0) {
    (**(code **)(*___a2_1 + 8))();
  }
  ::std::thread::operator=
            ((thread *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20),&local_68);
  ::std::thread::~thread(&local_68);
  local_78._M_ptr = (pointer)0x0;
  ::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_78);
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78._M_alloc =
       (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
        *)local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr;
  local_78._M_ptr =
       (pointer)local_88.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)&p_Var1->_M_impl;
  local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_ptr);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  if (local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    p_Var1 = (pointer)operator_new(0x40);
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00126988;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 8) = 0;
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x10) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
    *(undefined4 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x18) = 0;
    (p_Var1->_M_impl)._M_storage._M_storage.__align =
         (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_001269d8;
    local_78._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)&__a2_1;
    local_78._M_ptr = p_Var1;
    p_Var2 = (_Result<int> *)operator_new(0x18);
    ::std::__future_base::_Result<int>::_Result(p_Var2);
    *(_Result<int> **)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x20) = p_Var2;
    *(undefined8 *)((long)&(p_Var1->_M_impl)._M_storage._M_storage + 0x28) = in_RSI;
    local_78._M_ptr = (pointer)0x0;
    ::std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/push/src/gateway.cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_78);
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jupp0r[P]prometheus_cpp_push_src_gateway_cc:203:41)>_>,_int>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)local_88.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_78._M_ptr =
         (pointer)local_88.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&p_Var1->_M_impl;
    local_88.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_ptr);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  ::std::__basic_future<int>::__basic_future((__basic_future<int> *)this,&local_88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  fVar3.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar3.super___basic_future<int>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<int>)
         fVar3.super___basic_future<int>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<int> Gateway::AsyncDeleteForInstance() {
  return std::async(std::launch::async, [&] { return DeleteForInstance(); });
}